

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O3

void FILECleanUpLockedRgn(SHMPTR shmFileLocks,DWORD dwAccessRights,PVOID pvControllerInstance)

{
  SHMPTR *pSVar1;
  DWORD DVar2;
  DWORD DVar3;
  SHMPTR *pSVar4;
  DWORD *pDVar5;
  DWORD *pDVar6;
  LPVOID pvVar7;
  LPVOID pvVar8;
  DWORD *pDVar9;
  undefined8 uVar10;
  SHMPTR shmptr;
  
  SHMLock();
  if (shmFileLocks == 0) goto LAB_0032fa9c;
  pSVar4 = (SHMPTR *)SHMPtrToPtr(shmFileLocks);
  if (pSVar4 == (SHMPTR *)0x0) {
    uVar10 = 0x39e;
  }
  else {
    shmptr = pSVar4[1];
    if (shmptr == 0) {
LAB_0032f969:
      if ((int)dwAccessRights < 0) {
        *(int *)((long)pSVar4 + 0x2c) = *(int *)((long)pSVar4 + 0x2c) + -1;
      }
      if ((dwAccessRights >> 0x1e & 1) != 0) {
        *(int *)(pSVar4 + 6) = (int)pSVar4[6] + -1;
      }
      pSVar1 = pSVar4 + 2;
      *(int *)pSVar1 = (int)*pSVar1 + -1;
      if (((int)*pSVar1 != 0) || (pSVar4[1] != 0)) goto LAB_0032fa9c;
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_0032faf0:
        abort();
      }
      if (pSVar4[4] == 0) {
        pvVar7 = (LPVOID)0x0;
LAB_0032fa49:
        if (pSVar4[3] == 0) {
          pvVar8 = (LPVOID)0x0;
        }
        else {
          pvVar8 = SHMPtrToPtr(pSVar4[3]);
          if (pvVar8 == (LPVOID)0x0) goto LAB_0032fa5f;
        }
        if (pvVar7 == (LPVOID)0x0) {
          SHMSetInfo(SIID_FILE_LOCKS,pSVar4[3]);
        }
        else {
          *(SHMPTR *)((long)pvVar7 + 0x18) = pSVar4[3];
        }
        if (pvVar8 != (LPVOID)0x0) {
          *(SHMPTR *)((long)pvVar8 + 0x20) = pSVar4[4];
        }
        if (*pSVar4 != 0) {
          SHMfree(*pSVar4);
        }
        SHMfree(shmFileLocks);
        goto LAB_0032fa9c;
      }
      pvVar7 = SHMPtrToPtr(pSVar4[4]);
      if (pvVar7 != (LPVOID)0x0) goto LAB_0032fa49;
LAB_0032fa5f:
      uVar10 = 0x3ec;
    }
    else {
      pDVar5 = (DWORD *)SHMPtrToPtr(shmptr);
      if (pDVar5 == (DWORD *)0x0) {
        uVar10 = 0x3a9;
      }
      else {
        pDVar9 = (DWORD *)0x0;
        do {
          while( true ) {
            while ((*(PVOID *)(pDVar5 + 2) != pvControllerInstance ||
                   (DVar2 = *pDVar5, DVar3 = GetCurrentProcessId(), DVar2 != DVar3))) {
              shmptr = *(SHMPTR *)(pDVar5 + 10);
              if (shmptr == 0) goto LAB_0032f969;
              pDVar6 = (DWORD *)SHMPtrToPtr(shmptr);
              pDVar9 = pDVar5;
              pDVar5 = pDVar6;
              if (pDVar6 == (DWORD *)0x0) {
                uVar10 = 0x3d4;
                goto LAB_0032fa84;
              }
            }
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032faf0;
            if (pDVar9 == (DWORD *)0x0) break;
            *(SHMPTR *)(pDVar9 + 10) = *(SHMPTR *)(pDVar5 + 10);
            SHMfree(shmptr);
            shmptr = *(SHMPTR *)(pDVar9 + 10);
            if (shmptr == 0) goto LAB_0032f969;
            pDVar5 = (DWORD *)SHMPtrToPtr(shmptr);
            if (pDVar5 == (DWORD *)0x0) {
              uVar10 = 0x3c9;
              goto LAB_0032fa84;
            }
          }
          pSVar4[1] = *(SHMPTR *)(pDVar5 + 10);
          SHMfree(shmptr);
          shmptr = pSVar4[1];
          if (shmptr == 0) goto LAB_0032f969;
          pDVar5 = (DWORD *)SHMPtrToPtr(shmptr);
        } while (pDVar5 != (DWORD *)0x0);
        uVar10 = 0x3be;
      }
    }
  }
LAB_0032fa84:
  fprintf(_stderr,"] %s %s:%d","FILECleanUpLockedRgn",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
          ,uVar10);
  fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
LAB_0032fa9c:
  SHMRelease();
  return;
}

Assistant:

void
FILECleanUpLockedRgn(
    SHMPTR shmFileLocks,
    DWORD dwAccessRights,
    PVOID pvControllerInstance
    )
{
    SHMFILELOCKRGNS *curLockRgn = NULL, *prevLock = NULL;
    SHMFILELOCKS *fileLocks, *prevFileLocks, *nextFileLocks;
    SHMPTR shmcurLockRgn;    

    SHMLock();

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        goto EXIT;
    }

    if (fileLocks != NULL)
    {
        if(fileLocks->fileLockedRgns !=0)
        {        
            shmcurLockRgn = fileLocks->fileLockedRgns;
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                goto EXIT;
            }
            
            while(curLockRgn != NULL)
            {
                if ((curLockRgn->pvControllerInstance == pvControllerInstance) && 
                    (curLockRgn->processId == GetCurrentProcessId()))
                {
                    /* found the locked rgn to remove from SHM */
                    TRACE("Removing the locked region (%I64u, %I64u) from SMH\n", 
                          curLockRgn->lockRgnStart, curLockRgn->nbBytesLocked);
                    
                    if (prevLock == NULL) 
                    {
                        /* removing the first lock */
                        fileLocks->fileLockedRgns = curLockRgn->next;
                        SHMfree(shmcurLockRgn);
                        shmcurLockRgn = fileLocks->fileLockedRgns;
                        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                        {
                            ASSERT("Unable to get pointer from shm pointer.\n");
                            goto EXIT;
                        }
                    }
                    else
                    {
                        prevLock->next = curLockRgn->next;
                        SHMfree(shmcurLockRgn);
                        shmcurLockRgn = prevLock->next;
                        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                        {
                            ASSERT("Unable to get pointer from shm pointer.\n");
                            goto EXIT;
                        }
                    }
                    continue;
                }
                
                prevLock = curLockRgn;
                shmcurLockRgn = curLockRgn->next;
                if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                {
                    ASSERT("Unable to get pointer from shm pointer.\n");
                    goto EXIT;
                }
            }
        }
    
        if (dwAccessRights & GENERIC_READ)
        {   
            fileLocks->nbReadAccess--;      
        }
        if (dwAccessRights & GENERIC_WRITE)
        {
            fileLocks->nbWriteAccess--; 
        }  

        /* remove the SHMFILELOCKS structure from SHM if there's no more locked 
           region left and no more reference to it */        
        if ((--(fileLocks->refCount) == 0) && (fileLocks->fileLockedRgns == 0))
        {            
            TRACE("Removing the SHMFILELOCKS structure from SHM\n");

            if ( (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, prevFileLocks, fileLocks->prev) == FALSE) ||
                 (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, nextFileLocks, fileLocks->next) == FALSE))
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                goto EXIT;
            }

            if (prevFileLocks == NULL) 
            {
                /* removing the first lock file*/
                SHMSetInfo(SIID_FILE_LOCKS, fileLocks->next);
            }
            else
            {
                prevFileLocks->next = fileLocks->next;
            }

            if (nextFileLocks != NULL)
            {
                nextFileLocks->prev = fileLocks->prev;
            }

            if (fileLocks->unix_filename)
                SHMfree(fileLocks->unix_filename);

            SHMfree(shmFileLocks);
        }
    }    
EXIT:
    SHMRelease();
    return;
}